

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O2

void __thiscall
rigtorp::SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_>::~SPSCQueue
          (SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  unsigned_long *puVar1;
  
  while( true ) {
    puVar1 = front(this);
    if (puVar1 == (unsigned_long *)0x0) break;
    pop(this);
  }
  operator_delete(this->slots_,this->capacity_ * 8 + 0x80);
  return;
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }